

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# program.tab.hh
# Opt level: O0

binary_operator_t * __thiscall
tchecker::parsing::program::parser_t::value_type::as<tchecker::binary_operator_t>(value_type *this)

{
  bool bVar1;
  binary_operator_t *pbVar2;
  value_type *this_local;
  
  if (this->yytypeid_ == (type_info *)0x0) {
    __assert_fail("yytypeid_",
                  "/workspace/llm4binary/github/license_c_cmakelists/ticktac-project[P]tchecker/build_O0/src/parsing/program_parser/program.tab.hh"
                  ,0x144,
                  "T &tchecker::parsing::program::parser_t::value_type::as() [T = tchecker::binary_operator_t]"
                 );
  }
  bVar1 = std::type_info::operator==(this->yytypeid_,(type_info *)&binary_operator_t::typeinfo);
  if (!bVar1) {
    __assert_fail("*yytypeid_ == typeid (T)",
                  "/workspace/llm4binary/github/license_c_cmakelists/ticktac-project[P]tchecker/build_O0/src/parsing/program_parser/program.tab.hh"
                  ,0x145,
                  "T &tchecker::parsing::program::parser_t::value_type::as() [T = tchecker::binary_operator_t]"
                 );
  }
  pbVar2 = yyas_<tchecker::binary_operator_t>(this);
  return pbVar2;
}

Assistant:

T&
    as () YY_NOEXCEPT
    {
      PPYY_ASSERT (yytypeid_);
      PPYY_ASSERT (*yytypeid_ == typeid (T));
      PPYY_ASSERT (sizeof (T) <= size);
      return *yyas_<T> ();
    }